

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParseUnnamedTypeName(State *state)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int local_3c;
  undefined4 uStack_38;
  int which;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar2 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar2) {
    state_local._7_1_ = false;
  }
  else {
    uStack_38 = ((guard.state_)->parse_state).mangled_idx;
    which = ((guard.state_)->parse_state).out_cur_idx;
    copy.mangled_idx = ((guard.state_)->parse_state).prev_name_idx;
    copy.out_cur_idx = *(int *)&((guard.state_)->parse_state).field_0xc;
    local_3c = -1;
    bVar2 = ParseTwoCharToken(guard.state_,"Ut");
    if (bVar2) {
      bVar2 = ParseNumber(guard.state_,&local_3c);
      bVar2 = Optional(bVar2);
      iVar1 = local_3c;
      if (((bVar2) && (iVar3 = std::numeric_limits<int>::max(), iVar1 <= iVar3 + -2)) &&
         (bVar2 = ParseOneCharToken(guard.state_,'_'), bVar2)) {
        MaybeAppend(guard.state_,"{unnamed type#");
        MaybeAppendDecimal(guard.state_,local_3c + 2);
        MaybeAppend(guard.state_,"}");
        state_local._7_1_ = true;
        goto LAB_00572b28;
      }
    }
    ((guard.state_)->parse_state).mangled_idx = uStack_38;
    ((guard.state_)->parse_state).out_cur_idx = which;
    ((guard.state_)->parse_state).prev_name_idx = copy.mangled_idx;
    *(int *)&((guard.state_)->parse_state).field_0xc = copy.out_cur_idx;
    local_3c = -1;
    bVar2 = ParseTwoCharToken(guard.state_,"Ul");
    if ((((bVar2) && (bVar2 = DisableAppend(guard.state_), bVar2)) &&
        ((bVar2 = ZeroOrMore(ParseTemplateParamDecl,guard.state_), bVar2 &&
         ((bVar2 = OneOrMore(ParseType,guard.state_), bVar2 &&
          (bVar2 = RestoreAppend(guard.state_,(long)copy._0_8_ < 0), bVar2)))))) &&
       (bVar2 = ParseOneCharToken(guard.state_,'E'), bVar2)) {
      bVar2 = ParseNumber(guard.state_,&local_3c);
      bVar2 = Optional(bVar2);
      iVar1 = local_3c;
      if (((bVar2) && (iVar3 = std::numeric_limits<int>::max(), iVar1 <= iVar3 + -2)) &&
         (bVar2 = ParseOneCharToken(guard.state_,'_'), bVar2)) {
        MaybeAppend(guard.state_,"{lambda()#");
        MaybeAppendDecimal(guard.state_,local_3c + 2);
        MaybeAppend(guard.state_,"}");
        state_local._7_1_ = true;
        goto LAB_00572b28;
      }
    }
    ((guard.state_)->parse_state).mangled_idx = uStack_38;
    ((guard.state_)->parse_state).out_cur_idx = which;
    ((guard.state_)->parse_state).prev_name_idx = copy.mangled_idx;
    *(int *)&((guard.state_)->parse_state).field_0xc = copy.out_cur_idx;
    state_local._7_1_ = false;
  }
LAB_00572b28:
  copy._12_4_ = 1;
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseUnnamedTypeName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  // Type's 1-based index n is encoded as { "", n == 1; itoa(n-2), otherwise }.
  // Optionally parse the encoded value into 'which' and add 2 to get the index.
  int which = -1;

  // Unnamed type local to function or class.
  if (ParseTwoCharToken(state, "Ut") && Optional(ParseNumber(state, &which)) &&
      which <= std::numeric_limits<int>::max() - 2 &&  // Don't overflow.
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "{unnamed type#");
    MaybeAppendDecimal(state, 2 + which);
    MaybeAppend(state, "}");
    return true;
  }
  state->parse_state = copy;

  // Closure type.
  which = -1;
  if (ParseTwoCharToken(state, "Ul") && DisableAppend(state) &&
      ZeroOrMore(ParseTemplateParamDecl, state) &&
      OneOrMore(ParseType, state) && RestoreAppend(state, copy.append) &&
      ParseOneCharToken(state, 'E') && Optional(ParseNumber(state, &which)) &&
      which <= std::numeric_limits<int>::max() - 2 &&  // Don't overflow.
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "{lambda()#");
    MaybeAppendDecimal(state, 2 + which);
    MaybeAppend(state, "}");
    return true;
  }
  state->parse_state = copy;

  return false;
}